

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathEuler.h
# Opt level: O3

Matrix33<float> * __thiscall
Imath_3_2::Euler<float>::toMatrix33(Matrix33<float> *__return_storage_ptr__,Euler<float> *this)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  
  bVar1 = this->field_0xc;
  uVar7 = (ulong)(bVar1 >> 3) & 3;
  iVar6 = (int)uVar7;
  if ((bVar1 & 4) == 0) {
    iVar4 = 2;
    if (iVar6 != 0) {
      iVar4 = iVar6 + -1;
    }
    uVar5 = (iVar6 + (uint)((byte)uVar7 < 2) * 3) - 2;
  }
  else {
    iVar4 = iVar6 + (uint)((byte)uVar7 < 2) * 3 + -2;
    uVar5 = 2;
    if (iVar6 != 0) {
      uVar5 = iVar6 - 1;
    }
  }
  fVar14 = (&(this->super_Vec3<float>).x)[(ulong)(bVar1 & 1) * 2];
  fVar13 = (this->super_Vec3<float>).y;
  fVar12 = (&(this->super_Vec3<float>).x)[(ulong)((byte)~bVar1 & 1) * 2];
  if ((bVar1 & 4) == 0) {
    fVar12 = -fVar12;
    fVar13 = -fVar13;
    fVar14 = -fVar14;
  }
  fVar9 = cosf(fVar12);
  fVar10 = cosf(fVar13);
  fVar11 = cosf(fVar14);
  fVar12 = sinf(fVar12);
  fVar13 = sinf(fVar13);
  fVar14 = sinf(fVar14);
  fVar15 = fVar9 * fVar11;
  fVar17 = fVar9 * fVar14;
  fVar16 = fVar11 * fVar12;
  fVar18 = fVar12 * fVar14;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 0) = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 0) + 4) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[0] + 2) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 1.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  __return_storage_ptr__->x[2][2] = 1.0;
  if ((this->field_0xc & 2) == 0) {
    uVar8 = (ulong)(uint)(iVar6 << 2);
    *(float *)((long)__return_storage_ptr__->x[uVar7] + uVar8) = fVar11 * fVar10;
    lVar3 = (long)iVar4;
    *(float *)((long)__return_storage_ptr__->x[lVar3] + uVar8) = fVar13 * fVar16 - fVar17;
    uVar2 = (ulong)uVar5;
    *(float *)((long)__return_storage_ptr__->x[uVar2] + uVar8) = fVar13 * fVar15 + fVar18;
    __return_storage_ptr__->x[uVar7][lVar3] = fVar14 * fVar10;
    *(float *)((long)__return_storage_ptr__->x + lVar3 * 0x10) = fVar18 * fVar13 + fVar15;
    __return_storage_ptr__->x[uVar2][lVar3] = fVar13 * fVar17 - fVar16;
    __return_storage_ptr__->x[uVar7][uVar2] = -fVar13;
    __return_storage_ptr__->x[lVar3][uVar2] = fVar12 * fVar10;
    *(float *)((long)__return_storage_ptr__->x + uVar2 * 0x10) = fVar9 * fVar10;
  }
  else {
    uVar8 = (ulong)(uint)(iVar6 << 2);
    *(float *)((long)__return_storage_ptr__->x[uVar7] + uVar8) = fVar10;
    lVar3 = (long)iVar4;
    *(float *)((long)__return_storage_ptr__->x[lVar3] + uVar8) = fVar12 * fVar13;
    uVar2 = (ulong)uVar5;
    *(float *)((long)__return_storage_ptr__->x[uVar2] + uVar8) = fVar9 * fVar13;
    __return_storage_ptr__->x[uVar7][lVar3] = fVar14 * fVar13;
    *(float *)((long)__return_storage_ptr__->x + lVar3 * 0x10) = fVar15 - fVar10 * fVar18;
    __return_storage_ptr__->x[uVar2][lVar3] = -fVar10 * fVar17 - fVar16;
    __return_storage_ptr__->x[uVar7][uVar2] = fVar11 * -fVar13;
    __return_storage_ptr__->x[lVar3][uVar2] = fVar16 * fVar10 + fVar17;
    *(float *)((long)__return_storage_ptr__->x + uVar2 * 0x10) = fVar10 * fVar15 - fVar18;
  }
  return __return_storage_ptr__;
}

Assistant:

IMATH_HOSTDEVICE Matrix33<T>
                 Euler<T>::toMatrix33 () const IMATH_NOEXCEPT
{
    int i, j, k;
    angleOrder (i, j, k);

    Vec3<T> angles;

    if (_frameStatic)
        angles = (*this);
    else
        angles = Vec3<T> (z, y, x);

    if (!_parityEven) angles *= -1.0;

    T ci = std::cos (angles.x);
    T cj = std::cos (angles.y);
    T ch = std::cos (angles.z);
    T si = std::sin (angles.x);
    T sj = std::sin (angles.y);
    T sh = std::sin (angles.z);

    T cc = ci * ch;
    T cs = ci * sh;
    T sc = si * ch;
    T ss = si * sh;

    Matrix33<T> M;

    if (_initialRepeated)
    {
        M[i][i] = cj;
        M[j][i] = sj * si;
        M[k][i] = sj * ci;
        M[i][j] = sj * sh;
        M[j][j] = -cj * ss + cc;
        M[k][j] = -cj * cs - sc;
        M[i][k] = -sj * ch;
        M[j][k] = cj * sc + cs;
        M[k][k] = cj * cc - ss;
    }
    else
    {
        M[i][i] = cj * ch;
        M[j][i] = sj * sc - cs;
        M[k][i] = sj * cc + ss;
        M[i][j] = cj * sh;
        M[j][j] = sj * ss + cc;
        M[k][j] = sj * cs - sc;
        M[i][k] = -sj;
        M[j][k] = cj * si;
        M[k][k] = cj * ci;
    }

    return M;
}